

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPLastprivateClause::generateDOT
          (OpenMPLastprivateClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  bool bVar1;
  OpenMPLastprivateClauseModifier OVar2;
  char *pcVar3;
  long lVar4;
  reference ppcVar5;
  allocator<char> local_571;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_390;
  char **local_388;
  undefined1 local_380 [8];
  string expr_name;
  iterator iStack_358;
  int expr_index;
  iterator it;
  vector<const_char_*,_std::allocator<const_char_*>_> *expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string node_id;
  string parameter_string;
  undefined1 local_1a0 [4];
  OpenMPLastprivateClauseModifier modifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string clause_kind;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string indent;
  string current_line;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPLastprivateClause *this_local;
  
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,(long)depth,'\t',&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::to_string(&local_100,depth);
  std::operator+(&local_e0,"lastprivate_",&local_100);
  std::operator+(&local_c0,&local_e0,"_");
  std::__cxx11::to_string(&local_120,index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 parent_node);
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 "-- ");
  std::operator+(&local_160,&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_140,&local_160,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)local_1a0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar3);
  std::__cxx11::string::operator+=((string *)local_68,"\t");
  OVar2 = getModifier(this);
  std::__cxx11::string::string((string *)(node_id.field_2._M_local_buf + 8));
  if (OVar2 == OMPC_LASTPRIVATE_MODIFIER_conditional) {
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"conditional");
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_modifier");
    std::operator+(&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_248,&local_268," -- ");
    std::operator+(&local_228,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_208,&local_228,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "\t");
    std::operator+(&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_308,&local_328," [label = \"");
    std::operator+(&local_2e8,&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_2c8,&local_2e8,"\\n ");
    std::operator+(&local_2a8,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id.field_2 + 8));
    std::operator+(&local_288,&local_2a8,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&expr);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar3);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  it._M_current = (char **)OpenMPClause::getExpressions(&this->super_OpenMPClause);
  if ((vector<const_char_*,_std::allocator<const_char_*>_> *)it._M_current !=
      (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0) {
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffca8);
    expr_name.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)local_380);
    local_388 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (it._M_current);
    iStack_358 = (iterator)local_388;
    while( true ) {
      local_390._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffca8,&local_390);
      if (!bVar1) break;
      std::operator+(&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "_expr");
      std::__cxx11::to_string(&local_3f0,expr_name.field_2._12_4_);
      std::operator+(&local_3b0,&local_3d0,&local_3f0);
      std::__cxx11::string::operator=((string *)local_380,(string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3d0);
      expr_name.field_2._12_4_ = expr_name.field_2._12_4_ + 1;
      std::operator+(&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_450,&local_470," -- ");
      std::operator+(&local_430,&local_450,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380)
      ;
      std::operator+(&local_410,&local_430,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar3);
      std::operator+(&local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "\t");
      std::operator+(&local_530,&local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380)
      ;
      std::operator+(&local_510,&local_530," [label = \"");
      std::operator+(&local_4f0,&local_510,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380)
      ;
      std::operator+(&local_4d0,&local_4f0,"\\n ");
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffffca8);
      pcVar3 = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,pcVar3,&local_571);
      std::operator+(&local_4b0,&local_4d0,&local_570);
      std::operator+(&local_490,&local_4b0,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator(&local_571);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_550);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar3);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&stack0xfffffffffffffca8,0);
    }
    std::__cxx11::string::~string((string *)local_380);
  }
  std::__cxx11::string::~string((string *)(node_id.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  return;
}

Assistant:

void OpenMPLastprivateClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "lastprivate_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPLastprivateClauseModifier modifier = this->getModifier();
    std::string parameter_string;
    switch (modifier) {
        case OMPC_LASTPRIVATE_MODIFIER_conditional:
            parameter_string = "conditional";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_modifier";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };


    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}